

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parsePhotoSize_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  string *this_00;
  allocator local_39;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::PhotoSize,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_38);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    this_00 = &local_38;
    std::__cxx11::string::string((string *)this_00,"file_id",&local_39);
    appendToJson((TgTypeParser *)this_00,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::PhotoSize,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->fileId);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"width",&local_39);
    appendToJson<int>(this,__return_storage_ptr__,&local_38,
                      &((object->super___shared_ptr<TgBot::PhotoSize,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->width);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"height",&local_39);
    appendToJson<int>(this,__return_storage_ptr__,&local_38,
                      &((object->super___shared_ptr<TgBot::PhotoSize,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->height);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"file_size",&local_39);
    appendToJson<int>(this,__return_storage_ptr__,&local_38,
                      &((object->super___shared_ptr<TgBot::PhotoSize,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->fileSize);
    std::__cxx11::string::~string((string *)&local_38);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parsePhotoSize(const PhotoSize::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "file_id", object->fileId);
    appendToJson(result, "width", object->width);
    appendToJson(result, "height", object->height);
    appendToJson(result, "file_size", object->fileSize);
    removeLastComma(result);
    result += '}';
    return result;
}